

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFPageObjectHelper *h)

{
  allocator<char> local_41;
  string local_40;
  QPDFPageObjectHelper *local_20;
  QPDFPageObjectHelper *h_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  local_20 = h;
  h_local = (QPDFPageObjectHelper *)this;
  this_local = (QPDFAcroFormDocumentHelper *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/Widget",&local_41);
  QPDFPageObjectHelper::getAnnotations(__return_storage_ptr__,h,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(QPDFPageObjectHelper h)
{
    return h.getAnnotations("/Widget");
}